

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int fast_s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  int iVar1;
  mp_digit *pmVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  mp_digit W [512];
  ulong auStack_1038 [513];
  
  if ((c->alloc < digs) && (iVar6 = mp_grow(c,digs), iVar6 != 0)) {
    return iVar6;
  }
  iVar6 = a->used;
  iVar1 = b->used;
  uVar7 = iVar1 + iVar6;
  if ((int)uVar7 < digs) {
    digs = uVar7;
  }
  uVar13 = 0;
  if (0 < digs) {
    uVar13 = (ulong)(uint)digs;
  }
  lVar12 = 0;
  auVar5 = ZEXT816(0);
  for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
    iVar8 = iVar1 + -1;
    if ((long)uVar15 < (long)iVar1) {
      iVar8 = (int)uVar15;
    }
    puVar11 = b->dp + iVar8;
    iVar9 = (iVar8 - (int)uVar15) + iVar6;
    iVar14 = iVar8 + 1;
    if (iVar9 <= iVar8) {
      iVar14 = iVar9;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (lVar16 = 0; uVar10 = auVar5._0_8_, iVar14 != (int)lVar16; lVar16 = lVar16 + 1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *puVar11;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)a->dp + lVar16 * 8 + lVar12 + (long)iVar8 * -8);
      puVar11 = puVar11 + -1;
      auVar5 = auVar3 * auVar4 + auVar5;
    }
    auVar5 = auVar5 >> 0x3c;
    auStack_1038[uVar15] = uVar10 & 0xfffffffffffffff;
    lVar12 = lVar12 + 8;
  }
  iVar6 = c->used;
  c->used = digs;
  pmVar2 = c->dp;
  for (lVar12 = 0; lVar12 <= digs; lVar12 = lVar12 + 1) {
    pmVar2[lVar12] = auStack_1038[lVar12];
  }
  for (; (int)lVar12 < iVar6; lVar12 = lVar12 + 1) {
    pmVar2[lVar12] = 0;
  }
  mp_clamp(c);
  return 0;
}

Assistant:

int fast_s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  int     olduse, res, pa, ix, iz;
  mp_digit W[MP_WARRAY];
  register mp_word  _W;

  /* grow the destination as required */
  if (c->alloc < digs) {
    if ((res = mp_grow (c, digs)) != MP_OKAY) {
      return res;
    }
  }

  /* number of output digits to produce */
  pa = MIN(digs, a->used + b->used);

  /* clear the carry */
  _W = 0;
  for (ix = 0; ix < pa; ix++) { 
      int      tx, ty;
      int      iy;
      mp_digit *tmpx, *tmpy;

      /* get offsets into the two bignums */
      ty = MIN(b->used-1, ix);
      tx = ix - ty;

      /* setup temp aliases */
      tmpx = a->dp + tx;
      tmpy = b->dp + ty;

      /* this is the number of times the loop will iterrate, essentially 
         while (tx++ < a->used && ty-- >= 0) { ... }
       */
      iy = MIN(a->used-tx, ty+1);

      /* execute loop */
      for (iz = 0; iz < iy; ++iz) {
         _W += ((mp_word)*tmpx++)*((mp_word)*tmpy--);

      }

      /* store term */
      W[ix] = ((mp_digit)_W) & MP_MASK;

      /* make next carry */
      _W = _W >> ((mp_word)DIGIT_BIT);
 }

  /* setup dest */
  olduse  = c->used;
  c->used = pa;

  {
    register mp_digit *tmpc;
    tmpc = c->dp;
    for (ix = 0; ix < pa+1; ix++) {
      /* now extract the previous digit [below the carry] */
      *tmpc++ = W[ix];
    }

    /* clear unused digits [that existed in the old copy of c] */
    for (; ix < olduse; ix++) {
      *tmpc++ = 0;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}